

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustack.cpp
# Opt level: O0

void * __thiscall icu_63::UStack::pop(UStack *this)

{
  int32_t iVar1;
  int index;
  undefined8 local_20;
  void *result;
  int32_t n;
  UStack *this_local;
  
  iVar1 = UVector::size(&this->super_UVector);
  index = iVar1 + -1;
  local_20 = (void *)0x0;
  if (-1 < index) {
    local_20 = UVector::elementAt(&this->super_UVector,index);
    UVector::removeElementAt(&this->super_UVector,index);
  }
  return local_20;
}

Assistant:

void* UStack::pop(void) {
    int32_t n = size() - 1;
    void* result = 0;
    if (n >= 0) {
        result = elementAt(n);
        removeElementAt(n);
    }
    return result;
}